

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void __thiscall ON_SubDMeshFragment::Dump(ON_SubDMeshFragment *this,ON_TextLog *text_log)

{
  ON_SubDComponentLocation subd_appearance;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  size_t sVar6;
  ON_SurfaceCurvature *a;
  ON_Color *this_00;
  wchar_t *pwVar7;
  char *format;
  bool bVar8;
  ON_wString s;
  ON_TextLogIndent ident2;
  ON_TextLogIndent indent1;
  ON_SHA1_Hash local_c4;
  ON_SHA1 sha1;
  
  uVar1 = VertexCount(this);
  ON_TextLog::Print(text_log,"ON_SubDMeshFragment: vertex count = %u",(ulong)uVar1);
  uVar2 = ON_SubDMeshFragmentGrid::SideSegmentCount(&this->m_grid);
  uVar3 = ON_SubDMeshFragmentGrid::GridPointCount(&this->m_grid);
  if (uVar1 == 0) {
    ON_TextLog::PrintNewLine(text_log);
    return;
  }
  if ((uVar2 != 0) && (uVar1 == uVar3)) {
    ON_TextLog::Print(text_log,L", %u x %u grid\n",(ulong)uVar2,(ulong)uVar2);
    ON_TextLogIndent::ON_TextLogIndent(&indent1,text_log);
    ON_TextLog::Print(text_log,L"bounding box (%g to %g X %g to %g X %g to %g)\n",
                      (this->m_surface_bbox).m_min.x,(this->m_surface_bbox).m_max.x,
                      (this->m_surface_bbox).m_min.y,(this->m_surface_bbox).m_max.y,
                      (this->m_surface_bbox).m_min.z,(this->m_surface_bbox).m_max.z);
    ON_TextLog::Print(text_log,L"pack rect (%g,%g),(%g,%g),(%g,%g),(%g,%g) \n",
                      this->m_pack_rect[0][0],this->m_pack_rect[0][1],this->m_pack_rect[1][0],
                      this->m_pack_rect[1][1],this->m_pack_rect[2][0],this->m_pack_rect[2][1],
                      this->m_pack_rect[3][0],this->m_pack_rect[3][1]);
    for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
      format = "Surface:\n";
      if (iVar4 == 0) {
        format = "Corners:\n";
      }
      ON_TextLog::Print(text_log,format);
      ON_TextLogIndent::ON_TextLogIndent(&ident2,text_log);
      subd_appearance = Surface - (iVar4 == 0);
      pdVar5 = PointArray(this,subd_appearance);
      uVar1 = PointArrayCount(this,subd_appearance);
      sVar6 = PointArrayStride(this,subd_appearance);
      Internal_DumpFragmentArray(text_log,L"points",3,pdVar5,uVar1,sVar6);
      pdVar5 = NormalArray(this,subd_appearance);
      uVar1 = NormalArrayCount(this,subd_appearance);
      sVar6 = NormalArrayStride(this,subd_appearance);
      Internal_DumpFragmentArray(text_log,L"normals",3,pdVar5,uVar1,sVar6);
      pdVar5 = TextureCoordinateArray(this,subd_appearance);
      uVar1 = TextureCoordinateArrayCount(this,subd_appearance);
      sVar6 = TextureCoordinateArrayStride(this,subd_appearance);
      Internal_DumpFragmentArray(text_log,L"texture coordinates",3,pdVar5,uVar1,sVar6);
      a = CurvatureArray(this,subd_appearance);
      uVar1 = CurvatureArrayCount(this,subd_appearance);
      Internal_DumpFragmentArray(text_log,L"curvatures",2,&a->k1,uVar1,2);
      this_00 = ColorArray(this,subd_appearance);
      uVar1 = ColorArrayCount(this,subd_appearance);
      sVar6 = ColorArrayStride(this,subd_appearance);
      if (sVar6 == 0 || (uVar1 == 0 || this_00 == (ON_Color *)0x0)) {
        ON_TextLog::Print(text_log,L"%ls: Not set.",L"colors");
      }
      else {
        ON_TextLog::Print(text_log,L"%ls = ",L"colors");
        if (uVar1 < 5) {
          ON_TextLog::Print(text_log,"{");
          for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
            if (uVar2 != 0) {
              ON_TextLog::Print(text_log,L",");
            }
            ON_Color::ToText(this_00,HashRGBa,L'\0',true,text_log);
            this_00 = this_00 + sVar6;
          }
          ON_TextLog::Print(text_log,"}");
        }
        else {
          ON_Color::ToText(this_00,HashRGBa,L'\0',true,text_log);
          ON_SHA1::ON_SHA1(&sha1);
          ON_SHA1::AccumulateInteger32(&sha1,uVar1);
          while (bVar8 = uVar1 != 0, uVar1 = uVar1 - 1, bVar8) {
            uVar2 = ON_Color::operator_cast_to_unsigned_int(this_00);
            ON_SHA1::AccumulateInteger32(&sha1,uVar2);
            this_00 = this_00 + sVar6;
          }
          ON_SHA1::Hash(&local_c4,&sha1);
          ON_SHA1_Hash::ToString((ON_SHA1_Hash *)&s,SUB81(&local_c4,0));
          pwVar7 = ON_wString::operator_cast_to_wchar_t_(&s);
          ON_TextLog::Print(text_log,L" ... SHA1 hash=%ls",pwVar7);
          ON_wString::~ON_wString(&s);
        }
      }
      ON_TextLog::PrintNewLine(text_log);
      ON_TextLogIndent::~ON_TextLogIndent(&ident2);
    }
    ON_TextLogIndent::~ON_TextLogIndent(&indent1);
    return;
  }
  ON_TextLog::Print(text_log,L". Invalid fragment.\n");
  return;
}

Assistant:

void ON_SubDMeshFragment::Dump(ON_TextLog& text_log) const
{
  const unsigned count = VertexCount();
  text_log.Print("ON_SubDMeshFragment: vertex count = %u", count);
  const unsigned n = m_grid.SideSegmentCount();
  const unsigned grid_point_count = m_grid.GridPointCount();
  if (count > 0)
  {
    if (n > 0 && count == grid_point_count)
    {
      text_log.Print(
        L", %u x %u grid\n",
        n, n
      );

      ON_TextLogIndent indent1(text_log);
      text_log.Print(
        L"bounding box (%g to %g X %g to %g X %g to %g)\n",
        m_surface_bbox.m_min.x, m_surface_bbox.m_max.x,
        m_surface_bbox.m_min.y, m_surface_bbox.m_max.y,
        m_surface_bbox.m_min.z, m_surface_bbox.m_max.z
      );

      text_log.Print(
        L"pack rect (%g,%g),(%g,%g),(%g,%g),(%g,%g) \n",
        m_pack_rect[0][0], m_pack_rect[0][1],
        m_pack_rect[1][0], m_pack_rect[1][1],
        m_pack_rect[2][0], m_pack_rect[2][1],
        m_pack_rect[3][0], m_pack_rect[3][1]
      );

      for (int pass = 0; pass < 2; ++pass)
      {
        const ON_SubDComponentLocation cl = (0 == pass) ? ON_SubDComponentLocation::ControlNet : ON_SubDComponentLocation::Surface;
        if (ON_SubDComponentLocation::ControlNet == cl)
          text_log.Print("Corners:\n");
        else if (ON_SubDComponentLocation::Surface == cl)
          text_log.Print("Surface:\n");
        ON_TextLogIndent ident2(text_log);
        Internal_DumpFragmentArray(
          text_log, L"points", 3,
          PointArray(cl),
          PointArrayCount(cl),
          PointArrayStride(cl));
        Internal_DumpFragmentArray(
          text_log, L"normals", 3,
          NormalArray(cl),
          NormalArrayCount(cl),
          NormalArrayStride(cl));
        Internal_DumpFragmentArray(
          text_log, L"texture coordinates", 3, // tcs are uvw
          TextureCoordinateArray(cl),
          TextureCoordinateArrayCount(cl),
          TextureCoordinateArrayStride(cl));
        Internal_DumpFragmentArray(
          text_log, L"curvatures", 2, // 2 principal
          (const double*)(CurvatureArray(cl)),
          CurvatureArrayCount(cl),
          sizeof(ON_SurfaceCurvature)/sizeof(double));
        Internal_DumpFragmentColorArray(
          text_log, L"colors",
          ColorArray(cl),
          ColorArrayCount(cl),
          ColorArrayStride(cl)
        );
      }
    }
    else
    {
      text_log.Print(L". Invalid fragment.\n");
    }
  }
  else
  {
    text_log.PrintNewLine();
  }
}